

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

Expression * __thiscall
rsg::BinaryOp<7,_(rsg::Associativity)0>::createNextChild
          (BinaryOp<7,_(rsg::Associativity)0> *this,GeneratorState *state)

{
  pointer *ppiVar1;
  iterator iVar2;
  ConstValueRangeAccess valueRange;
  Scalar *pSVar3;
  Expression *pEVar4;
  Scalar *pSVar5;
  undefined1 (*pauVar6) [16];
  ValueRange *pVVar7;
  Expression **ppEVar8;
  int local_4c;
  undefined1 local_48 [24];
  undefined1 local_30 [24];
  
  if (this->m_rightValueExpr == (Expression *)0x0) {
    local_4c = 6;
    iVar2._M_current =
         (state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&state->m_precedenceStack,iVar2,&local_4c);
    }
    else {
      *iVar2._M_current = 6;
      (state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    ppEVar8 = &this->m_rightValueExpr;
    pVVar7 = &this->m_rightValueRange;
    pSVar5 = (this->m_rightValueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->m_rightValueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar5 == (this->m_rightValueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar5 = (Scalar *)0x0;
    }
    if (pSVar3 == (this->m_rightValueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar3 = (Scalar *)0x0;
    }
    pauVar6 = (undefined1 (*) [16])local_30;
  }
  else {
    if (this->m_leftValueExpr != (Expression *)0x0) {
      return (Expression *)0x0;
    }
    local_4c = 7;
    iVar2._M_current =
         (state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&state->m_precedenceStack,iVar2,&local_4c);
    }
    else {
      *iVar2._M_current = 7;
      (state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    ppEVar8 = &this->m_leftValueExpr;
    pVVar7 = &this->m_leftValueRange;
    pSVar5 = (this->m_leftValueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->m_leftValueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar5 == (this->m_leftValueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar5 = (Scalar *)0x0;
    }
    if (pSVar3 == (this->m_leftValueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar3 = (Scalar *)0x0;
    }
    pauVar6 = (undefined1 (*) [16])local_48;
  }
  *(ValueRange **)*pauVar6 = pVVar7;
  *(Scalar **)(*pauVar6 + 8) = pSVar5;
  *(Scalar **)pauVar6[1] = pSVar3;
  valueRange.m_max = pSVar3;
  valueRange._0_16_ = *pauVar6;
  pEVar4 = Expression::createRandom(state,valueRange);
  *ppEVar8 = pEVar4;
  ppiVar1 = &(state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar1 = *ppiVar1 + -1;
  return pEVar4;
}

Assistant:

Expression* BinaryOp<Precedence, Assoc>::createNextChild (GeneratorState& state)
{
	int leftPrec	= Assoc == ASSOCIATIVITY_LEFT ? Precedence : Precedence-1;
	int rightPrec	= Assoc == ASSOCIATIVITY_LEFT ? Precedence-1 : Precedence;

	if (m_rightValueExpr == DE_NULL)
	{
		state.pushPrecedence(rightPrec);
		m_rightValueExpr = Expression::createRandom(state, m_rightValueRange.asAccess());
		state.popPrecedence();
		return m_rightValueExpr;
	}
	else if (m_leftValueExpr == DE_NULL)
	{
		state.pushPrecedence(leftPrec);
		m_leftValueExpr = Expression::createRandom(state, m_leftValueRange.asAccess());
		state.popPrecedence();
		return m_leftValueExpr;
	}
	else
		return DE_NULL;
}